

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

DOMElement * __thiscall
xercesc_4_0::TraverseSchema::checkContent
          (TraverseSchema *this,DOMElement *rootElem,DOMElement *contentElem,bool isEmpty,
          bool processAnnot)

{
  short sVar1;
  short sVar2;
  int iVar3;
  XMLCh *text1;
  undefined4 extraout_var;
  XSAnnotation *pXVar5;
  DOMElement *elem;
  undefined4 extraout_var_00;
  short *psVar6;
  short *psVar4;
  
  text1 = getElementAttValue(this,rootElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  this->fAnnotation = (XSAnnotation *)0x0;
  if (contentElem == (DOMElement *)0x0) {
    pXVar5 = (XSAnnotation *)0x0;
    if (isEmpty) {
      contentElem = (DOMElement *)0x0;
    }
    else {
      reportSchemaError(this,rootElem,L"http://apache.org/xml/messages/XMLErrors",0x23,text1,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      contentElem = (DOMElement *)0x0;
    }
    goto LAB_0032870e;
  }
  iVar3 = (*(contentElem->super_DOMNode)._vptr_DOMNode[0x18])(contentElem);
  psVar4 = (short *)CONCAT44(extraout_var,iVar3);
  if (psVar4 != &SchemaSymbols::fgELT_ANNOTATION) {
    psVar6 = &SchemaSymbols::fgELT_ANNOTATION;
    if (psVar4 != (short *)0x0) {
      pXVar5 = (XSAnnotation *)0x0;
      do {
        sVar1 = *psVar4;
        if (sVar1 == 0) goto LAB_003285fe;
        psVar4 = psVar4 + 1;
        sVar2 = *psVar6;
        psVar6 = psVar6 + 1;
      } while (sVar1 == sVar2);
      goto LAB_0032870e;
    }
LAB_003285fe:
    if (*psVar6 != 0) {
      pXVar5 = (XSAnnotation *)0x0;
      goto LAB_0032870e;
    }
  }
  if (processAnnot) {
    pXVar5 = traverseAnnotationDecl(this,contentElem,this->fNonXSAttList,false);
  }
  else {
    pXVar5 = (XSAnnotation *)0x0;
  }
  elem = XUtil::getNextSiblingElement(&contentElem->super_DOMNode);
  if (elem == (DOMElement *)0x0) {
    elem = (DOMElement *)0x0;
    if (!isEmpty) {
      reportSchemaError(this,contentElem,L"http://apache.org/xml/messages/XMLErrors",0x23,text1,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      elem = (DOMElement *)0x0;
    }
  }
  else {
    iVar3 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])(elem);
    psVar4 = (short *)CONCAT44(extraout_var_00,iVar3);
    if (psVar4 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_003286e7:
      contentElem = (DOMElement *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x3d,text1,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0032870e;
    }
    psVar6 = &SchemaSymbols::fgELT_ANNOTATION;
    if (psVar4 == (short *)0x0) {
LAB_003286d3:
      if (*psVar6 == 0) goto LAB_003286e7;
    }
    else {
      do {
        sVar1 = *psVar4;
        if (sVar1 == 0) goto LAB_003286d3;
        psVar4 = psVar4 + 1;
        sVar2 = *psVar6;
        psVar6 = psVar6 + 1;
      } while (sVar1 == sVar2);
    }
  }
  contentElem = elem;
  this->fAnnotation = pXVar5;
  pXVar5 = (XSAnnotation *)0x0;
LAB_0032870e:
  if (pXVar5 != (XSAnnotation *)0x0) {
    (*(pXVar5->super_XSerializable)._vptr_XSerializable[1])(pXVar5);
  }
  return contentElem;
}

Assistant:

DOMElement* TraverseSchema::checkContent( const DOMElement* const rootElem
                                        , DOMElement* const contentElem
                                        , const bool isEmpty
                                        , const bool processAnnot)
{
    DOMElement* content = contentElem;
    const XMLCh* name = getElementAttValue(rootElem,SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    fAnnotation = 0;
    Janitor<XSAnnotation> janAnnot(0);
    if (!content) {

       if (!isEmpty) {
           reportSchemaError(rootElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
       }

       return 0;
    }

    if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

        if (processAnnot) {
            janAnnot.reset(traverseAnnotationDecl(content, fNonXSAttList));
        }
        content = XUtil::getNextSiblingElement(content);

        if (!content) { // must be followed by content

            if (!isEmpty) {
                reportSchemaError(contentElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
            }
            fAnnotation = janAnnot.release();
            return 0;
        }

        if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

            reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnnotationError, name);
            return 0;
        }
        fAnnotation = janAnnot.release();
    }
    return content;
}